

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O1

void __thiscall
sglr::GLContext::invalidateSubFramebuffer
          (GLContext *this,deUint32 target,int numAttachments,deUint32 *attachments,int x,int y,
          int width,int height)

{
  ostringstream *this_00;
  deUint32 dVar1;
  int iVar2;
  undefined4 extraout_var;
  int iVar3;
  int iVar4;
  EnumPointerFmt local_1d8;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  dVar1 = this->m_drawFramebufferBinding;
  iVar3 = (this->m_baseViewport).m_data[0];
  iVar4 = (this->m_baseViewport).m_data[1];
  if ((this->m_logFlags & 1) != 0) {
    local_1b0._0_8_ = this->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"glInvalidateSubFramebuffer(",0x1b);
    local_1c0.m_getName = glu::getFramebufferTargetName;
    local_1c0.m_value = target;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,numAttachments);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    glu::getInvalidateAttachmentStr(attachments,numAttachments);
    glu::detail::operator<<((ostream *)this_00,&local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,x);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,y);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,width);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,height);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
  }
  if (dVar1 != 0) {
    iVar3 = 0;
    iVar4 = 0;
  }
  iVar2 = (*this->m_context->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0xc50))
            (target,numAttachments,attachments,iVar3 + x,iVar4 + y,width,height);
  return;
}

Assistant:

void GLContext::invalidateSubFramebuffer (deUint32 target, int numAttachments, const deUint32* attachments, int x, int y, int width, int height)
{
	tcu::IVec2 drawOffset = getDrawOffset();

	if ((m_logFlags & GLCONTEXT_LOG_CALLS) != 0)
		m_log << TestLog::Message << "glInvalidateSubFramebuffer("
								  << glu::getFramebufferTargetStr(target) << ", " << numAttachments << ", "
								  << glu::getInvalidateAttachmentStr(attachments, numAttachments) << ", "
								  << x << ", " << y << ", " << width << ", " << height << ")"
			  << TestLog::EndMessage;

	m_context.getFunctions().invalidateSubFramebuffer(target, numAttachments, attachments, x+drawOffset.x(), y+drawOffset.y(), width, height);
}